

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageResize(Image *image,int newWidth,int newHeight)

{
  int iVar1;
  uchar *output_pixels;
  int format;
  Color *output_1;
  Color *pixels;
  uchar *output;
  int bytesPerPixel;
  _Bool fastPath;
  int newHeight_local;
  int newWidth_local;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    iVar1 = GetPixelDataSize(1,1,image->format);
    output_pixels = (uchar *)malloc((long)(newWidth * newHeight * iVar1));
    switch(image->format) {
    case 1:
      stbir_resize_uint8((uchar *)image->data,image->width,image->height,0,output_pixels,newWidth,
                         newHeight,0,1);
      break;
    case 2:
      stbir_resize_uint8((uchar *)image->data,image->width,image->height,0,output_pixels,newWidth,
                         newHeight,0,2);
      break;
    default:
      break;
    case 4:
      stbir_resize_uint8((uchar *)image->data,image->width,image->height,0,output_pixels,newWidth,
                         newHeight,0,3);
      break;
    case 7:
      stbir_resize_uint8((uchar *)image->data,image->width,image->height,0,output_pixels,newWidth,
                         newHeight,0,4);
    }
    free(image->data);
    image->data = output_pixels;
    image->width = newWidth;
    image->height = newHeight;
  }
  return;
}

Assistant:

void ImageResize(Image *image, int newWidth, int newHeight)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    bool fastPath = true;
    if ((image->format != PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) && (image->format != PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8)) fastPath = true;

    if (fastPath)
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *output = RL_MALLOC(newWidth*newHeight*bytesPerPixel);

        switch (image->format)
        {
            case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 1); break;
            case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 2); break;
            case PIXELFORMAT_UNCOMPRESSED_R8G8B8: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 3); break;
            case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 4); break;
            default: break;
        }

        RL_FREE(image->data);
        image->data = output;
        image->width = newWidth;
        image->height = newHeight;
    }
    else
    {
        // Get data as Color pixels array to work with it
        Color *pixels = LoadImageColors(*image);
        Color *output = (Color *)RL_MALLOC(newWidth*newHeight*sizeof(Color));

        // NOTE: Color data is casted to (unsigned char *), there shouldn't been any problem...
        stbir_resize_uint8((unsigned char *)pixels, image->width, image->height, 0, (unsigned char *)output, newWidth, newHeight, 0, 4);

        int format = image->format;

        UnloadImageColors(pixels);
        RL_FREE(image->data);

        image->data = output;
        image->width = newWidth;
        image->height = newHeight;
        image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

        ImageFormat(image, format);  // Reformat 32bit RGBA image to original format
    }
}